

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O0

void __thiscall Liby::UdpSocket::UdpSocket(UdpSocket *this,EventLoop *loop,SockPtr *socket)

{
  int iVar1;
  element_type *this_00;
  Poller *pPVar2;
  unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_> local_38 [3];
  __shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_20;
  SockPtr *socket_local;
  EventLoop *loop_local;
  UdpSocket *this_local;
  
  local_20 = (__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)socket;
  socket_local = (SockPtr *)loop;
  loop_local = (EventLoop *)this;
  std::enable_shared_from_this<Liby::UdpSocket>::enable_shared_from_this
            (&this->super_enable_shared_from_this<Liby::UdpSocket>);
  this->destroy_ = false;
  this_00 = std::__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->(local_20);
  iVar1 = Socket::fd(this_00);
  this->sockfd_ = iVar1;
  std::shared_ptr<Liby::Socket>::shared_ptr(&this->socket_,(shared_ptr<Liby::Socket> *)local_20);
  pPVar2 = EventLoop::getPoller((EventLoop *)socket_local);
  this->poller_ = pPVar2;
  this->loop_ = (EventLoop *)socket_local;
  std::unique_ptr<Liby::Channel,std::default_delete<Liby::Channel>>::
  unique_ptr<std::default_delete<Liby::Channel>,void>
            ((unique_ptr<Liby::Channel,std::default_delete<Liby::Channel>> *)&this->chan_);
  std::
  map<Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>,_std::less<Liby::Endpoint>,_std::allocator<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>_>
  ::map(&this->conns_);
  std::deque<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>::deque(&this->writTasks_);
  std::function<void_(Liby::UdpConnection_&)>::function(&this->acceptorCallback_);
  std::function<void_(Liby::UdpConnection_&)>::function(&this->readEventCallback_);
  std::function<void_(Liby::UdpConnection_&)>::function(&this->connectorCallback_);
  std::function<void_(Liby::UdpSocket_&)>::function(&this->erroEventCallback_);
  std::shared_ptr<Liby::UdpSocket>::shared_ptr(&this->self_);
  std::make_unique<Liby::Channel,Liby::Poller*&,int&>((Poller **)local_38,(int *)&this->poller_);
  std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::operator=
            (&this->chan_,local_38);
  std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::~unique_ptr(local_38);
  return;
}

Assistant:

UdpSocket::UdpSocket(EventLoop *loop, const SockPtr &socket)
    : sockfd_(socket->fd()), socket_(socket), poller_(loop->getPoller()),
      loop_(loop) {
    chan_ = std::make_unique<Channel>(poller_, sockfd_);
}